

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.cc
# Opt level: O0

uint64_t hashstring(substring s,uint64_t h)

{
  uint64_t uVar1;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar2;
  uint64_t unaff_retaddr;
  char *p;
  size_t ret;
  char *local_30;
  long local_28;
  char *local_18;
  char *local_10;
  
  local_18 = in_RDI;
  while( true ) {
    bVar2 = false;
    if ((local_18 < in_RSI) && (bVar2 = false, *local_18 < '!')) {
      bVar2 = -1 < *local_18;
    }
    local_10 = in_RSI;
    if (!bVar2) break;
    local_18 = local_18 + 1;
  }
  while( true ) {
    bVar2 = false;
    if ((local_18 < local_10) && (bVar2 = false, local_10[-1] < '!')) {
      bVar2 = -1 < local_10[-1];
    }
    if (!bVar2) break;
    local_10 = local_10 + -1;
  }
  local_28 = 0;
  local_30 = local_18;
  while( true ) {
    if (local_30 == local_10) {
      return local_28 + in_RDX;
    }
    if ((*local_30 < '0') || ('9' < *local_30)) break;
    local_28 = local_28 * 10 + (long)*local_30 + -0x30;
    local_30 = local_30 + 1;
  }
  uVar1 = uniform_hash((void *)ret,(size_t)p,unaff_retaddr);
  return uVar1;
}

Assistant:

uint64_t hashstring(substring s, uint64_t h)
{
  // trim leading whitespace but not UTF-8
  for (; s.begin < s.end && *(s.begin) <= 0x20 && (int)*(s.begin) >= 0; s.begin++)
    ;
  // trim trailing white space but not UTF-8
  for (; s.end > s.begin && *(s.end - 1) <= 0x20 && (int)*(s.end - 1) >= 0; s.end--)
    ;

  size_t ret = 0;
  char* p = s.begin;
  while (p != s.end)
    if (*p >= '0' && *p <= '9')
      ret = 10 * ret + *(p++) - '0';
    else
      return uniform_hash((unsigned char*)s.begin, s.end - s.begin, h);

  return ret + h;
}